

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

dtime_tz_t __thiscall
duckdb::Cast::Operation<duckdb::string_t,duckdb::dtime_tz_t>(Cast *this,string_t input)

{
  string_t str;
  bool bVar1;
  ConversionException *this_00;
  char *buf;
  bool has_offset;
  dtime_tz_t result;
  idx_t pos;
  bool local_51;
  dtime_tz_t in_stack_ffffffffffffffb0;
  idx_t local_28;
  
  buf = &stack0xffffffffffffffbc;
  if (0xc < ((ulong)this & 0xffffffff)) {
    buf = input.value._0_8_;
  }
  bVar1 = Time::TryConvertTimeTZ
                    (buf,(ulong)this & 0xffffffff,&local_28,(dtime_tz_t *)&stack0xffffffffffffffb0,
                     &local_51,false,(optional_ptr<int,_true>)0x0);
  if (bVar1) {
    return (dtime_tz_t)in_stack_ffffffffffffffb0.bits;
  }
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  str.value.pointer.ptr = (char *)this;
  str.value._0_8_ = in_stack_ffffffffffffffb0.bits;
  Time::ConversionError_abi_cxx11_(str);
  ConversionException::ConversionException(this_00,(string *)&stack0xffffffffffffffb8);
  __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

dtime_tz_t Cast::Operation(string_t input) {
	dtime_tz_t result;
	if (!TryCast::Operation(input, result, false)) {
		throw ConversionException(Time::ConversionError(input));
	}
	return result;
}